

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert.hpp
# Opt level: O0

bool bitmanip::detail::cmp<(bitmanip::detail::Cmp)0,unsigned_long_long,unsigned_int>
               (unsigned_long_long *l,uint *r)

{
  uint *r_local;
  unsigned_long_long *l_local;
  
  return *l == (ulong)*r;
}

Assistant:

constexpr bool cmp(const L &l, const R &r) noexcept
{
    if constexpr (eq(Cmp, Cmp::EQ))
        return l == r;
    else if constexpr (eq(Cmp, Cmp::NE))
        return l != r;
    else if constexpr (eq(Cmp, Cmp::GT))
        return l > r;
    else if constexpr (eq(Cmp, Cmp::LT))
        return l < r;
    else if constexpr (eq(Cmp, Cmp::GE))
        return l >= r;
    else if constexpr (eq(Cmp, Cmp::LE))
        return l <= r;
}